

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O2

iter_type __thiscall
booster::locale::util::base_num_format<wchar_t>::format_time
          (base_num_format<wchar_t> *this,iter_type out,ios_base *ios,char_type_conflict fill,
          time_t time,string_type *format)

{
  pointer pwVar1;
  streambuf_type *psVar2;
  size_type sVar3;
  int iVar4;
  ios_info *this_00;
  time_put *ptVar5;
  long lVar6;
  long lVar7;
  iter_type iVar8;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> __result;
  iter_type out_local;
  time_t time_local;
  string_type str;
  vector<char,_std::allocator<char>_> tmp_buf;
  string tz;
  locale local_1e0;
  tm tm;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> tmp_out;
  long alStack_b8 [18];
  
  out_local._M_sbuf = out._M_sbuf;
  out_local._M_failed = out._M_failed;
  time_local = time;
  this_00 = ios_info::get(ios);
  ios_info::time_zone_abi_cxx11_(&tz,this_00);
  std::vector<char,std::allocator<char>>::vector<char_const*,void>
            ((vector<char,std::allocator<char>> *)&tmp_buf,tz._M_dataplus._M_p,
             tz._M_dataplus._M_p + tz._M_string_length + 1,(allocator_type *)&tmp_out);
  if (tz._M_string_length == 0) {
    localtime_r(&time_local,(tm *)&tm);
  }
  else {
    iVar4 = parse_tz(&tz);
    time_local = time_local + iVar4;
    gmtime_r(&time_local,(tm *)&tm);
    if (iVar4 != 0) {
      tm.tm_zone = tmp_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
      tm.tm_gmtoff = (long)iVar4;
    }
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&tmp_out);
  std::locale::locale((locale *)&str,(locale *)(ios + 0xd0));
  ptVar5 = std::
           use_facet<std::time_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                     ((locale *)&str);
  lVar7 = *(long *)((long)alStack_b8 + *(long *)(_tmp_out + -0x18));
  pwVar1 = (format->_M_dataplus)._M_p;
  std::time_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::put
            (ptVar5,lVar7,lVar7 == 0,&tmp_out + *(long *)(_tmp_out + -0x18),fill,&tm,pwVar1,
             pwVar1 + format->_M_string_length);
  std::locale::~locale((locale *)&str);
  std::__cxx11::wstringbuf::str();
  std::locale::locale(&local_1e0,(locale *)(ios + 0xd0));
  sVar3 = str._M_string_length;
  std::locale::~locale(&local_1e0);
  lVar7 = *(long *)(ios + 0x10) - sVar3;
  if (lVar7 == 0 || *(long *)(ios + 0x10) < (long)sVar3) {
    lVar7 = 0;
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    if ((*(uint *)(ios + 0x18) & 0xb0) != 0x20) {
      lVar6 = lVar7;
    }
    lVar7 = lVar7 - lVar6;
  }
  for (; 0 < lVar6; lVar6 = lVar6 + -1) {
    std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator=(&out_local,fill);
  }
  __result._M_failed = out_local._M_failed;
  __result._9_3_ = out_local._9_3_;
  __result._M_sbuf = out_local._M_sbuf;
  __result._12_4_ = 0;
  std::__copy_move_a2<false,wchar_t>
            (str._M_dataplus._M_p,str._M_dataplus._M_p + str._M_string_length,__result);
  for (; psVar2 = out_local._M_sbuf, 0 < lVar7; lVar7 = lVar7 + -1) {
    std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator=(&out_local,fill);
  }
  *(undefined8 *)(ios + 0x10) = 0;
  iVar8._9_3_ = (int3)((uint)fill >> 8);
  iVar8._M_failed = out_local._M_failed;
  std::__cxx11::wstring::~wstring((wstring *)&str);
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)&tmp_out);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tmp_buf.super__Vector_base<char,_std::allocator<char>_>);
  std::__cxx11::string::~string((string *)&tz);
  iVar8._M_sbuf = psVar2;
  iVar8._12_4_ = 0;
  return iVar8;
}

Assistant:

iter_type format_time(iter_type out,std::ios_base &ios,char_type fill,std::time_t time,string_type const &format) const
    {
        std::string tz = ios_info::get(ios).time_zone();
        std::tm tm;
        #if defined(__linux) || defined(__FreeBSD__) || defined(__APPLE__) 
        std::vector<char> tmp_buf(tz.c_str(),tz.c_str()+tz.size()+1);
        #endif
        if(tz.empty()) {
            #ifdef BOOSTER_WIN_NATIVE
            /// Windows uses TLS
            tm = *localtime(&time);
            #else
            localtime_r(&time,&tm);
            #endif
        }
        else  {
            int gmtoff = parse_tz(tz);
            time+=gmtoff;
            #ifdef BOOSTER_WIN_NATIVE
            /// Windows uses TLS
            tm = *gmtime(&time);
            #else
            gmtime_r(&time,&tm);
            #endif
            
            #if defined(__linux) || defined(__FreeBSD__) || defined(__APPLE__) 
            // These have extra fields to specify timezone
            if(gmtoff!=0) {
                // bsd and apple want tm_zone be non-const
                tm.tm_zone=&tmp_buf.front();
                tm.tm_gmtoff = gmtoff;
            }
            #endif
        }
        std::basic_ostringstream<char_type> tmp_out;
        std::use_facet<std::time_put<char_type> >(ios.getloc()).put(tmp_out,tmp_out,fill,&tm,format.c_str(),format.c_str()+format.size());
        string_type str = tmp_out.str();
        std::streamsize on_left=0,on_right = 0;
        std::streamsize points = 
            formatting_size_traits<char_type>::size(str,ios.getloc());
        if(points < ios.width()) {
            std::streamsize n = ios.width() - points;
            
            std::ios_base::fmtflags flags = ios.flags() & std::ios_base::adjustfield;
            
            //
            // we do not really know internal point, so we assume that it does not
            // exist. so according to the standard field should be right aligned
            //
            if(flags != std::ios_base::left)
                on_left = n;
            on_right = n - on_left;
        }
        while(on_left > 0) {
            *out++ = fill;
            on_left--;
        }
        std::copy(str.begin(),str.end(),out);
        while(on_right > 0) {
            *out++ = fill;
            on_right--;
        }
        ios.width(0);
        return out;
    }